

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_meta.cc
# Opt level: O2

void __thiscall SelectiveBranchingMT::task_data::~task_data(task_data *this)

{
  string *this_00;
  
  v_array<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>_>::delete_v(&this->branches);
  v_array<std::pair<std::pair<float,_v_array<std::pair<unsigned_int,_float>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::delete_v(&this->final);
  v_array<std::pair<unsigned_int,_float>_>::delete_v(&this->trajectory);
  this_00 = this->output_string;
  if (this_00 != (string *)0x0) {
    std::__cxx11::string::~string((string *)this_00);
    operator_delete(this_00);
  }
  if (this->kbest_out != (stringstream *)0x0) {
    (**(code **)(*(long *)this->kbest_out + 8))();
    return;
  }
  return;
}

Assistant:

~task_data()
  {
    branches.delete_v();
    final.delete_v();
    trajectory.delete_v();
    if (output_string)
      delete output_string;
    if (kbest_out)
      delete kbest_out;
  }